

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O0

void * alcGetProcAddress(ALCdevice *_device,ALCchar *funcname)

{
  int iVar1;
  DeviceWrapper *local_30;
  code *local_28;
  void *retval;
  DeviceWrapper *device;
  ALCchar *funcname_local;
  ALCdevice *_device_local;
  
  local_30 = (DeviceWrapper *)_device;
  if (_device == (ALCdevice *)0x0) {
    local_30 = &null_device;
  }
  local_28 = (code *)0x0;
  APILOCK();
  IO_ENTRYINFO(ALEE_alcGetProcAddress);
  IO_PTR(_device);
  IO_STRING(funcname);
  if ((((funcname == (ALCchar *)0x0) || (*funcname != 'a')) || (funcname[1] != 'l')) ||
     (funcname[2] != 'c')) {
    local_28 = (code *)0x0;
  }
  else {
    iVar1 = strcmp(funcname,"alcGetCurrentContext");
    if (iVar1 == 0) {
      local_28 = alcGetCurrentContext;
    }
    else {
      iVar1 = strcmp(funcname,"alcGetContextsDevice");
      if (iVar1 == 0) {
        local_28 = alcGetContextsDevice;
      }
      else {
        iVar1 = strcmp(funcname,"alcIsExtensionPresent");
        if (iVar1 == 0) {
          local_28 = alcIsExtensionPresent;
        }
        else {
          iVar1 = strcmp(funcname,"alcGetProcAddress");
          if (iVar1 == 0) {
            local_28 = alcGetProcAddress;
          }
          else {
            iVar1 = strcmp(funcname,"alcGetEnumValue");
            if (iVar1 == 0) {
              local_28 = alcGetEnumValue;
            }
            else {
              iVar1 = strcmp(funcname,"alcGetString");
              if (iVar1 == 0) {
                local_28 = alcGetString;
              }
              else {
                iVar1 = strcmp(funcname,"alcCaptureOpenDevice");
                if (iVar1 == 0) {
                  local_28 = alcCaptureOpenDevice;
                }
                else {
                  iVar1 = strcmp(funcname,"alcCaptureCloseDevice");
                  if (iVar1 == 0) {
                    local_28 = alcCaptureCloseDevice;
                  }
                  else {
                    iVar1 = strcmp(funcname,"alcOpenDevice");
                    if (iVar1 == 0) {
                      local_28 = alcOpenDevice;
                    }
                    else {
                      iVar1 = strcmp(funcname,"alcCloseDevice");
                      if (iVar1 == 0) {
                        local_28 = alcCloseDevice;
                      }
                      else {
                        iVar1 = strcmp(funcname,"alcCreateContext");
                        if (iVar1 == 0) {
                          local_28 = alcCreateContext;
                        }
                        else {
                          iVar1 = strcmp(funcname,"alcMakeContextCurrent");
                          if (iVar1 == 0) {
                            local_28 = alcMakeContextCurrent;
                          }
                          else {
                            iVar1 = strcmp(funcname,"alcProcessContext");
                            if (iVar1 == 0) {
                              local_28 = alcProcessContext;
                            }
                            else {
                              iVar1 = strcmp(funcname,"alcSuspendContext");
                              if (iVar1 == 0) {
                                local_28 = alcSuspendContext;
                              }
                              else {
                                iVar1 = strcmp(funcname,"alcDestroyContext");
                                if (iVar1 == 0) {
                                  local_28 = alcDestroyContext;
                                }
                                else {
                                  iVar1 = strcmp(funcname,"alcGetError");
                                  if (iVar1 == 0) {
                                    local_28 = alcGetError;
                                  }
                                  else {
                                    iVar1 = strcmp(funcname,"alcGetIntegerv");
                                    if (iVar1 == 0) {
                                      local_28 = alcGetIntegerv;
                                    }
                                    else {
                                      iVar1 = strcmp(funcname,"alcCaptureStart");
                                      if (iVar1 == 0) {
                                        local_28 = alcCaptureStart;
                                      }
                                      else {
                                        iVar1 = strcmp(funcname,"alcCaptureStop");
                                        if (iVar1 == 0) {
                                          local_28 = alcCaptureStop;
                                        }
                                        else {
                                          iVar1 = strcmp(funcname,"alcCaptureSamples");
                                          if (iVar1 == 0) {
                                            local_28 = alcCaptureSamples;
                                          }
                                          else {
                                            iVar1 = strcmp(funcname,"alDopplerFactor");
                                            if (iVar1 == 0) {
                                              local_28 = alDopplerFactor;
                                            }
                                            else {
                                              iVar1 = strcmp(funcname,"alDopplerVelocity");
                                              if (iVar1 == 0) {
                                                local_28 = alDopplerVelocity;
                                              }
                                              else {
                                                iVar1 = strcmp(funcname,"alSpeedOfSound");
                                                if (iVar1 == 0) {
                                                  local_28 = alSpeedOfSound;
                                                }
                                                else {
                                                  iVar1 = strcmp(funcname,"alDistanceModel");
                                                  if (iVar1 == 0) {
                                                    local_28 = alDistanceModel;
                                                  }
                                                  else {
                                                    iVar1 = strcmp(funcname,"alEnable");
                                                    if (iVar1 == 0) {
                                                      local_28 = alEnable;
                                                    }
                                                    else {
                                                      iVar1 = strcmp(funcname,"alDisable");
                                                      if (iVar1 == 0) {
                                                        local_28 = alDisable;
                                                      }
                                                      else {
                                                        iVar1 = strcmp(funcname,"alIsEnabled");
                                                        if (iVar1 == 0) {
                                                          local_28 = alIsEnabled;
                                                        }
                                                        else {
                                                          iVar1 = strcmp(funcname,"alGetString");
                                                          if (iVar1 == 0) {
                                                            local_28 = alGetString;
                                                          }
                                                          else {
                                                            iVar1 = strcmp(funcname,"alGetBooleanv")
                                                            ;
                                                            if (iVar1 == 0) {
                                                              local_28 = alGetBooleanv;
                                                            }
                                                            else {
                                                              iVar1 = strcmp(funcname,
                                                  "alGetIntegerv");
                                                  if (iVar1 == 0) {
                                                    local_28 = alGetIntegerv;
                                                  }
                                                  else {
                                                    iVar1 = strcmp(funcname,"alGetFloatv");
                                                    if (iVar1 == 0) {
                                                      local_28 = alGetFloatv;
                                                    }
                                                    else {
                                                      iVar1 = strcmp(funcname,"alGetDoublev");
                                                      if (iVar1 == 0) {
                                                        local_28 = alGetDoublev;
                                                      }
                                                      else {
                                                        iVar1 = strcmp(funcname,"alGetBoolean");
                                                        if (iVar1 == 0) {
                                                          local_28 = alGetBoolean;
                                                        }
                                                        else {
                                                          iVar1 = strcmp(funcname,"alGetInteger");
                                                          if (iVar1 == 0) {
                                                            local_28 = alGetInteger;
                                                          }
                                                          else {
                                                            iVar1 = strcmp(funcname,"alGetFloat");
                                                            if (iVar1 == 0) {
                                                              local_28 = alGetFloat;
                                                            }
                                                            else {
                                                              iVar1 = strcmp(funcname,"alGetDouble")
                                                              ;
                                                              if (iVar1 == 0) {
                                                                local_28 = alGetDouble;
                                                              }
                                                              else {
                                                                iVar1 = strcmp(funcname,
                                                  "alIsExtensionPresent");
                                                  if (iVar1 == 0) {
                                                    local_28 = alIsExtensionPresent;
                                                  }
                                                  else {
                                                    iVar1 = strcmp(funcname,"alGetError");
                                                    if (iVar1 == 0) {
                                                      local_28 = alGetError;
                                                    }
                                                    else {
                                                      iVar1 = strcmp(funcname,"alGetProcAddress");
                                                      if (iVar1 == 0) {
                                                        local_28 = alGetProcAddress;
                                                      }
                                                      else {
                                                        iVar1 = strcmp(funcname,"alGetEnumValue");
                                                        if (iVar1 == 0) {
                                                          local_28 = alGetEnumValue;
                                                        }
                                                        else {
                                                          iVar1 = strcmp(funcname,"alListenerfv");
                                                          if (iVar1 == 0) {
                                                            local_28 = alListenerfv;
                                                          }
                                                          else {
                                                            iVar1 = strcmp(funcname,"alListenerf");
                                                            if (iVar1 == 0) {
                                                              local_28 = alListenerf;
                                                            }
                                                            else {
                                                              iVar1 = strcmp(funcname,"alListener3f"
                                                                            );
                                                              if (iVar1 == 0) {
                                                                local_28 = alListener3f;
                                                              }
                                                              else {
                                                                iVar1 = strcmp(funcname,
                                                  "alListeneriv");
                                                  if (iVar1 == 0) {
                                                    local_28 = alListeneriv;
                                                  }
                                                  else {
                                                    iVar1 = strcmp(funcname,"alListeneri");
                                                    if (iVar1 == 0) {
                                                      local_28 = alListeneri;
                                                    }
                                                    else {
                                                      iVar1 = strcmp(funcname,"alListener3i");
                                                      if (iVar1 == 0) {
                                                        local_28 = alListener3i;
                                                      }
                                                      else {
                                                        iVar1 = strcmp(funcname,"alGetListenerfv");
                                                        if (iVar1 == 0) {
                                                          local_28 = alGetListenerfv;
                                                        }
                                                        else {
                                                          iVar1 = strcmp(funcname,"alGetListenerf");
                                                          if (iVar1 == 0) {
                                                            local_28 = alGetListenerf;
                                                          }
                                                          else {
                                                            iVar1 = strcmp(funcname,
                                                  "alGetListener3f");
                                                  if (iVar1 == 0) {
                                                    local_28 = alGetListener3f;
                                                  }
                                                  else {
                                                    iVar1 = strcmp(funcname,"alGetListeneri");
                                                    if (iVar1 == 0) {
                                                      local_28 = alGetListeneri;
                                                    }
                                                    else {
                                                      iVar1 = strcmp(funcname,"alGetListeneriv");
                                                      if (iVar1 == 0) {
                                                        local_28 = alGetListeneriv;
                                                      }
                                                      else {
                                                        iVar1 = strcmp(funcname,"alGetListener3i");
                                                        if (iVar1 == 0) {
                                                          local_28 = alGetListener3i;
                                                        }
                                                        else {
                                                          iVar1 = strcmp(funcname,"alGenSources");
                                                          if (iVar1 == 0) {
                                                            local_28 = alGenSources;
                                                          }
                                                          else {
                                                            iVar1 = strcmp(funcname,
                                                  "alDeleteSources");
                                                  if (iVar1 == 0) {
                                                    local_28 = alDeleteSources;
                                                  }
                                                  else {
                                                    iVar1 = strcmp(funcname,"alIsSource");
                                                    if (iVar1 == 0) {
                                                      local_28 = alIsSource;
                                                    }
                                                    else {
                                                      iVar1 = strcmp(funcname,"alSourcefv");
                                                      if (iVar1 == 0) {
                                                        local_28 = alSourcefv;
                                                      }
                                                      else {
                                                        iVar1 = strcmp(funcname,"alSourcef");
                                                        if (iVar1 == 0) {
                                                          local_28 = alSourcef;
                                                        }
                                                        else {
                                                          iVar1 = strcmp(funcname,"alSource3f");
                                                          if (iVar1 == 0) {
                                                            local_28 = alSource3f;
                                                          }
                                                          else {
                                                            iVar1 = strcmp(funcname,"alSourceiv");
                                                            if (iVar1 == 0) {
                                                              local_28 = alSourceiv;
                                                            }
                                                            else {
                                                              iVar1 = strcmp(funcname,"alSourcei");
                                                              if (iVar1 == 0) {
                                                                local_28 = alSourcei;
                                                              }
                                                              else {
                                                                iVar1 = strcmp(funcname,"alSource3i"
                                                                              );
                                                                if (iVar1 == 0) {
                                                                  local_28 = alSource3i;
                                                                }
                                                                else {
                                                                  iVar1 = strcmp(funcname,
                                                  "alGetSourcefv");
                                                  if (iVar1 == 0) {
                                                    local_28 = alGetSourcefv;
                                                  }
                                                  else {
                                                    iVar1 = strcmp(funcname,"alGetSourcef");
                                                    if (iVar1 == 0) {
                                                      local_28 = alGetSourcef;
                                                    }
                                                    else {
                                                      iVar1 = strcmp(funcname,"alGetSource3f");
                                                      if (iVar1 == 0) {
                                                        local_28 = alGetSource3f;
                                                      }
                                                      else {
                                                        iVar1 = strcmp(funcname,"alGetSourceiv");
                                                        if (iVar1 == 0) {
                                                          local_28 = alGetSourceiv;
                                                        }
                                                        else {
                                                          iVar1 = strcmp(funcname,"alGetSourcei");
                                                          if (iVar1 == 0) {
                                                            local_28 = alGetSourcei;
                                                          }
                                                          else {
                                                            iVar1 = strcmp(funcname,"alGetSource3i")
                                                            ;
                                                            if (iVar1 == 0) {
                                                              local_28 = alGetSource3i;
                                                            }
                                                            else {
                                                              iVar1 = strcmp(funcname,"alSourcePlay"
                                                                            );
                                                              if (iVar1 == 0) {
                                                                local_28 = alSourcePlay;
                                                              }
                                                              else {
                                                                iVar1 = strcmp(funcname,
                                                  "alSourcePlayv");
                                                  if (iVar1 == 0) {
                                                    local_28 = alSourcePlayv;
                                                  }
                                                  else {
                                                    iVar1 = strcmp(funcname,"alSourcePause");
                                                    if (iVar1 == 0) {
                                                      local_28 = alSourcePause;
                                                    }
                                                    else {
                                                      iVar1 = strcmp(funcname,"alSourcePausev");
                                                      if (iVar1 == 0) {
                                                        local_28 = alSourcePausev;
                                                      }
                                                      else {
                                                        iVar1 = strcmp(funcname,"alSourceRewind");
                                                        if (iVar1 == 0) {
                                                          local_28 = alSourceRewind;
                                                        }
                                                        else {
                                                          iVar1 = strcmp(funcname,"alSourceRewindv")
                                                          ;
                                                          if (iVar1 == 0) {
                                                            local_28 = alSourceRewindv;
                                                          }
                                                          else {
                                                            iVar1 = strcmp(funcname,"alSourceStop");
                                                            if (iVar1 == 0) {
                                                              local_28 = alSourceStop;
                                                            }
                                                            else {
                                                              iVar1 = strcmp(funcname,
                                                  "alSourceStopv");
                                                  if (iVar1 == 0) {
                                                    local_28 = alSourceStopv;
                                                  }
                                                  else {
                                                    iVar1 = strcmp(funcname,"alSourceQueueBuffers");
                                                    if (iVar1 == 0) {
                                                      local_28 = alSourceQueueBuffers;
                                                    }
                                                    else {
                                                      iVar1 = strcmp(funcname,
                                                  "alSourceUnqueueBuffers");
                                                  if (iVar1 == 0) {
                                                    local_28 = alSourceUnqueueBuffers;
                                                  }
                                                  else {
                                                    iVar1 = strcmp(funcname,"alGenBuffers");
                                                    if (iVar1 == 0) {
                                                      local_28 = alGenBuffers;
                                                    }
                                                    else {
                                                      iVar1 = strcmp(funcname,"alDeleteBuffers");
                                                      if (iVar1 == 0) {
                                                        local_28 = alDeleteBuffers;
                                                      }
                                                      else {
                                                        iVar1 = strcmp(funcname,"alIsBuffer");
                                                        if (iVar1 == 0) {
                                                          local_28 = alIsBuffer;
                                                        }
                                                        else {
                                                          iVar1 = strcmp(funcname,"alBufferData");
                                                          if (iVar1 == 0) {
                                                            local_28 = alBufferData;
                                                          }
                                                          else {
                                                            iVar1 = strcmp(funcname,"alBufferfv");
                                                            if (iVar1 == 0) {
                                                              local_28 = alBufferfv;
                                                            }
                                                            else {
                                                              iVar1 = strcmp(funcname,"alBufferf");
                                                              if (iVar1 == 0) {
                                                                local_28 = alBufferf;
                                                              }
                                                              else {
                                                                iVar1 = strcmp(funcname,"alBuffer3f"
                                                                              );
                                                                if (iVar1 == 0) {
                                                                  local_28 = alBuffer3f;
                                                                }
                                                                else {
                                                                  iVar1 = strcmp(funcname,
                                                  "alBufferiv");
                                                  if (iVar1 == 0) {
                                                    local_28 = alBufferiv;
                                                  }
                                                  else {
                                                    iVar1 = strcmp(funcname,"alBufferi");
                                                    if (iVar1 == 0) {
                                                      local_28 = alBufferi;
                                                    }
                                                    else {
                                                      iVar1 = strcmp(funcname,"alBuffer3i");
                                                      if (iVar1 == 0) {
                                                        local_28 = alBuffer3i;
                                                      }
                                                      else {
                                                        iVar1 = strcmp(funcname,"alGetBufferfv");
                                                        if (iVar1 == 0) {
                                                          local_28 = alGetBufferfv;
                                                        }
                                                        else {
                                                          iVar1 = strcmp(funcname,"alGetBufferf");
                                                          if (iVar1 == 0) {
                                                            local_28 = alGetBufferf;
                                                          }
                                                          else {
                                                            iVar1 = strcmp(funcname,"alGetBuffer3f")
                                                            ;
                                                            if (iVar1 == 0) {
                                                              local_28 = alGetBuffer3f;
                                                            }
                                                            else {
                                                              iVar1 = strcmp(funcname,"alGetBufferi"
                                                                            );
                                                              if (iVar1 == 0) {
                                                                local_28 = alGetBufferi;
                                                              }
                                                              else {
                                                                iVar1 = strcmp(funcname,
                                                  "alGetBuffer3i");
                                                  if (iVar1 == 0) {
                                                    local_28 = alGetBuffer3i;
                                                  }
                                                  else {
                                                    iVar1 = strcmp(funcname,"alGetBufferiv");
                                                    if (iVar1 == 0) {
                                                      local_28 = alGetBufferiv;
                                                    }
                                                    else {
                                                      iVar1 = strcmp(funcname,"alTracePushScope");
                                                      if (iVar1 == 0) {
                                                        local_28 = alTracePushScope;
                                                      }
                                                      else {
                                                        iVar1 = strcmp(funcname,"alTracePopScope");
                                                        if (iVar1 == 0) {
                                                          local_28 = alTracePopScope;
                                                        }
                                                        else {
                                                          iVar1 = strcmp(funcname,"alTraceMessage");
                                                          if (iVar1 == 0) {
                                                            local_28 = alTraceMessage;
                                                          }
                                                          else {
                                                            iVar1 = strcmp(funcname,
                                                  "alTraceBufferLabel");
                                                  if (iVar1 == 0) {
                                                    local_28 = alTraceBufferLabel;
                                                  }
                                                  else {
                                                    iVar1 = strcmp(funcname,"alTraceSourceLabel");
                                                    if (iVar1 == 0) {
                                                      local_28 = alTraceSourceLabel;
                                                    }
                                                    else {
                                                      iVar1 = strcmp(funcname,"alcTraceDeviceLabel")
                                                      ;
                                                      if (iVar1 == 0) {
                                                        local_28 = alcTraceDeviceLabel;
                                                      }
                                                      else {
                                                        iVar1 = strcmp(funcname,
                                                  "alcTraceContextLabel");
                                                  if (iVar1 == 0) {
                                                    local_28 = alcTraceContextLabel;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  IO_PTR(local_28);
  check_alc_error_events(local_30);
  check_al_async_states();
  APIUNLOCK();
  return local_28;
}

Assistant:

void *alcGetProcAddress(ALCdevice *_device, const ALCchar *funcname)
{
    DeviceWrapper *device = _device ? (DeviceWrapper *) _device : &null_device;
    void *retval = NULL;
    IO_START(alcGetProcAddress);
    IO_PTR(_device);
    IO_STRING(funcname);

    // always return our entry points, so the app always calls through here.
    if (!funcname || ((funcname[0] != 'a') || (funcname[1] != 'l') || (funcname[2] != 'c'))) {
        // !!! FIXME: should set an error state.
        retval = NULL;
    }
    #define ENTRYPOINT(ret,fn,params,args,numargs,visitparams,visitargs) else if (strcmp(funcname, #fn) == 0) { retval = (void *) fn; }
    #include "altrace_entrypoints.h"

    IO_PTR(retval);
    IO_END_ALC(device);
    return retval;

}